

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareB44.cpp
# Opt level: O0

void compareB44(int width,int height,Array2D<Imf_3_2::Rgba> *p1,Array2D<Imf_3_2::Rgba> *p2,
               RgbaChannels channels)

{
  bool bVar1;
  int *piVar2;
  Rgba *pRVar3;
  Array2D<Imf_3_2::Rgba> *in_RCX;
  Array2D<Imf_3_2::Rgba> *in_RDX;
  int in_ESI;
  int in_EDI;
  uint in_R8D;
  float fVar4;
  int x_7;
  int y_7;
  int x2_3;
  int y2_3;
  int x1_3;
  int y1_3;
  half B_3 [4] [4];
  half A_3 [4] [4];
  int x_6;
  int y_6;
  int x_5;
  int y_5;
  int x2_2;
  int y2_2;
  int x1_2;
  int y1_2;
  half B_2 [4] [4];
  half A_2 [4] [4];
  int x_4;
  int y_4;
  int x_3;
  int y_3;
  int x2_1;
  int y2_1;
  int x1_1;
  int y1_1;
  half B_1 [4] [4];
  half A_1 [4] [4];
  int x_2;
  int y_2;
  int x_1;
  int y_1;
  int x2;
  int y2;
  int x1;
  int y1;
  half B [4] [4];
  half A [4] [4];
  int x;
  int y;
  undefined4 in_stack_fffffffffffffe20;
  int iVar5;
  undefined4 in_stack_fffffffffffffe24;
  int iVar6;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  uint16_t local_1b8 [16];
  uint16_t local_198 [16];
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  uint16_t local_148 [16];
  uint16_t local_128 [16];
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  uint16_t local_d8 [4];
  half (*in_stack_ffffffffffffff30) [4];
  half (*in_stack_ffffffffffffff38) [4];
  uint16_t local_b8 [16];
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  uint16_t local_68 [16];
  uint16_t local_48 [18];
  int local_24;
  int local_20;
  uint local_1c;
  Array2D<Imf_3_2::Rgba> *local_18;
  Array2D<Imf_3_2::Rgba> *local_10;
  int local_8;
  int local_4;
  
  local_1c = in_R8D;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  if ((in_R8D & 1) == 0) {
    for (local_8c = 0; local_8c < local_8; local_8c = local_8c + 1) {
      for (local_90 = 0; local_90 < local_4; local_90 = local_90 + 1) {
        Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_8c);
        fVar4 = Imath_3_2::half::operator_cast_to_float
                          ((half *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          __assert_fail("p2[y][x].r == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0xed,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  else {
    for (local_20 = 0; local_20 < local_8; local_20 = local_20 + 4) {
      for (local_24 = 0; local_24 < local_4; local_24 = local_24 + 4) {
        for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
          for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
            local_78 = local_20 + local_6c;
            local_7c = local_8 + -1;
            piVar2 = std::min<int>(&local_78,&local_7c);
            local_74 = *piVar2;
            local_84 = local_24 + local_70;
            local_88 = local_4 + -1;
            piVar2 = std::min<int>(&local_84,&local_88);
            local_80 = *piVar2;
            pRVar3 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_10,(long)local_74);
            local_48[(long)local_6c * 4 + (long)local_70] = pRVar3[local_80].r._h;
            pRVar3 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_74);
            local_68[(long)local_6c * 4 + (long)local_70] = pRVar3[local_80].r._h;
          }
        }
        bVar1 = withinB44ErrorBounds(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        if (!bVar1) {
          __assert_fail("withinB44ErrorBounds (A, B)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0xe5,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  if ((local_1c & 2) == 0) {
    for (local_fc = 0; local_fc < local_8; local_fc = local_fc + 1) {
      for (local_100 = 0; local_100 < local_4; local_100 = local_100 + 1) {
        Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_fc);
        fVar4 = Imath_3_2::half::operator_cast_to_float
                          ((half *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          __assert_fail("p2[y][x].g == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0x10c,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  else {
    for (local_94 = 0; local_94 < local_8; local_94 = local_94 + 4) {
      for (local_98 = 0; local_98 < local_4; local_98 = local_98 + 4) {
        for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
          for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
            local_e8 = local_94 + local_dc;
            local_ec = local_8 + -1;
            piVar2 = std::min<int>(&local_e8,&local_ec);
            local_e4 = *piVar2;
            local_f4 = local_98 + local_e0;
            local_f8 = local_4 + -1;
            piVar2 = std::min<int>(&local_f4,&local_f8);
            local_f0 = *piVar2;
            pRVar3 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_10,(long)local_e4);
            local_b8[(long)local_dc * 4 + (long)local_e0] = pRVar3[local_f0].g._h;
            pRVar3 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_e4);
            local_d8[(long)local_dc * 4 + (long)local_e0] = pRVar3[local_f0].g._h;
          }
        }
        bVar1 = withinB44ErrorBounds(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        if (!bVar1) {
          __assert_fail("withinB44ErrorBounds (A, B)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0x104,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  if ((local_1c & 4) == 0) {
    for (local_16c = 0; local_16c < local_8; local_16c = local_16c + 1) {
      for (local_170 = 0; local_170 < local_4; local_170 = local_170 + 1) {
        Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_16c);
        fVar4 = Imath_3_2::half::operator_cast_to_float
                          ((half *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          __assert_fail("p2[y][x].b == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,299,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  else {
    for (local_104 = 0; local_104 < local_8; local_104 = local_104 + 4) {
      for (local_108 = 0; local_108 < local_4; local_108 = local_108 + 4) {
        for (local_14c = 0; local_14c < 4; local_14c = local_14c + 1) {
          for (local_150 = 0; local_150 < 4; local_150 = local_150 + 1) {
            local_158 = local_104 + local_14c;
            local_15c = local_8 + -1;
            piVar2 = std::min<int>(&local_158,&local_15c);
            local_154 = *piVar2;
            local_164 = local_108 + local_150;
            local_168 = local_4 + -1;
            piVar2 = std::min<int>(&local_164,&local_168);
            local_160 = *piVar2;
            pRVar3 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_10,(long)local_154);
            local_128[(long)local_14c * 4 + (long)local_150] = pRVar3[local_160].b._h;
            pRVar3 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_154);
            local_148[(long)local_14c * 4 + (long)local_150] = pRVar3[local_160].b._h;
          }
        }
        bVar1 = withinB44ErrorBounds(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        if (!bVar1) {
          __assert_fail("withinB44ErrorBounds (A, B)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0x123,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  if ((local_1c & 8) == 0) {
    for (iVar6 = 0; iVar6 < local_8; iVar6 = iVar6 + 1) {
      for (iVar5 = 0; iVar5 < local_4; iVar5 = iVar5 + 1) {
        Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)iVar6);
        fVar4 = Imath_3_2::half::operator_cast_to_float((half *)CONCAT44(iVar6,iVar5));
        if ((fVar4 != 1.0) || (NAN(fVar4))) {
          __assert_fail("p2[y][x].a == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0x14a,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  else {
    for (local_174 = 0; local_174 < local_8; local_174 = local_174 + 4) {
      for (local_178 = 0; local_178 < local_4; local_178 = local_178 + 4) {
        for (local_1bc = 0; local_1bc < 4; local_1bc = local_1bc + 1) {
          for (local_1c0 = 0; local_1c0 < 4; local_1c0 = local_1c0 + 1) {
            local_1c8 = local_174 + local_1bc;
            local_1cc = local_8 + -1;
            piVar2 = std::min<int>(&local_1c8,&local_1cc);
            local_1c4 = *piVar2;
            local_1d4 = local_178 + local_1c0;
            local_1d8 = local_4 + -1;
            piVar2 = std::min<int>(&local_1d4,&local_1d8);
            local_1d0 = *piVar2;
            pRVar3 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_10,(long)local_1c4);
            local_198[(long)local_1bc * 4 + (long)local_1c0] = pRVar3[local_1d0].a._h;
            pRVar3 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_1c4);
            local_1b8[(long)local_1bc * 4 + (long)local_1c0] = pRVar3[local_1d0].a._h;
          }
        }
        bVar1 = withinB44ErrorBounds(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        if (!bVar1) {
          __assert_fail("withinB44ErrorBounds (A, B)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                        ,0x142,
                        "void compareB44(int, int, const Array2D<Rgba> &, const Array2D<Rgba> &, RgbaChannels)"
                       );
        }
      }
    }
  }
  return;
}

Assistant:

void
compareB44 (
    int                  width,
    int                  height,
    const Array2D<Rgba>& p1,
    const Array2D<Rgba>& p2,
    RgbaChannels         channels)
{
    if (channels & WRITE_R)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].r;
                        B[y1][x1] = p2[y2][x2].r;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].r == 0);
    }

    if (channels & WRITE_G)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].g;
                        B[y1][x1] = p2[y2][x2].g;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].g == 0);
    }

    if (channels & WRITE_B)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].b;
                        B[y1][x1] = p2[y2][x2].b;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].b == 0);
    }

    if (channels & WRITE_A)
    {
        for (int y = 0; y < height; y += 4)
        {
            for (int x = 0; x < width; x += 4)
            {
                half A[4][4];
                half B[4][4];

                for (int y1 = 0; y1 < 4; ++y1)
                {
                    for (int x1 = 0; x1 < 4; ++x1)
                    {
                        int y2    = min (y + y1, height - 1);
                        int x2    = min (x + x1, width - 1);
                        A[y1][x1] = p1[y2][x2].a;
                        B[y1][x1] = p2[y2][x2].a;
                    }
                }

                assert (withinB44ErrorBounds (A, B));
            }
        }
    }
    else
    {
        for (int y = 0; y < height; y += 1)
            for (int x = 0; x < width; x += 1)
                assert (p2[y][x].a == 1);
    }
}